

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

int maxdirfiltered<btVector3>
              (btVector3 *p,int count,btVector3 *dir,btAlignedObjectArray<int> *allow)

{
  int *piVar1;
  btAlignedObjectArray<int> *in_RCX;
  int in_ESI;
  btScalar bVar2;
  int i;
  int m;
  btVector3 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  btScalar in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  
  local_24 = -1;
  local_28 = 0;
  do {
    if (in_ESI <= local_28) {
      return local_24;
    }
    piVar1 = btAlignedObjectArray<int>::operator[](in_RCX,local_28);
    if (*piVar1 != 0) {
      if (local_24 != -1) {
        in_stack_ffffffffffffffd4 =
             btDot((btVector3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        bVar2 = btDot((btVector3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
        if (in_stack_ffffffffffffffd4 <= bVar2) goto LAB_00149a73;
      }
      local_24 = local_28;
    }
LAB_00149a73:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int maxdirfiltered(const T *p,int count,const T &dir,btAlignedObjectArray<int> &allow)
{
	btAssert(count);
	int m=-1;
	for(int i=0;i<count;i++) 
		if(allow[i])
		{
			if(m==-1 || btDot(p[i],dir)>btDot(p[m],dir))
				m=i;
		}
	btAssert(m!=-1);
	return m;
}